

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cbtSimulationIslandManager.cpp
# Opt level: O2

void __thiscall
cbtSimulationIslandManager::updateActivationState
          (cbtSimulationIslandManager *this,cbtCollisionWorld *colWorld,cbtDispatcher *dispatcher)

{
  uint uVar1;
  cbtCollisionObject *pcVar2;
  ulong uVar3;
  int N;
  cbtDispatcher *pcVar4;
  
  uVar1 = (colWorld->m_collisionObjects).m_size;
  pcVar4 = (cbtDispatcher *)0x0;
  for (uVar3 = 0; N = (int)pcVar4, (~((int)uVar1 >> 0x1f) & uVar1) != uVar3; uVar3 = uVar3 + 1) {
    pcVar2 = (colWorld->m_collisionObjects).m_data[uVar3];
    if ((pcVar2->m_collisionFlags & 3) == 0) {
      pcVar2->m_islandTag1 = N;
      pcVar4 = (cbtDispatcher *)(ulong)(N + 1);
    }
    pcVar2->m_companionId = -1;
    pcVar2->m_hitFraction = 1.0;
  }
  cbtUnionFind::reset(&this->m_unionFind,N);
  findUnions(this,pcVar4,colWorld);
  return;
}

Assistant:

void cbtSimulationIslandManager::updateActivationState(cbtCollisionWorld* colWorld, cbtDispatcher* dispatcher)
{
	// put the index into m_controllers into m_tag
	int index = 0;
	{
		int i;
		for (i = 0; i < colWorld->getCollisionObjectArray().size(); i++)
		{
			cbtCollisionObject* collisionObject = colWorld->getCollisionObjectArray()[i];
			//Adding filtering here
			if (!collisionObject->isStaticOrKinematicObject())
			{
				collisionObject->setIslandTag(index++);
			}
			collisionObject->setCompanionId(-1);
			collisionObject->setHitFraction(cbtScalar(1.));
		}
	}
	// do the union find

	initUnionFind(index);

	findUnions(dispatcher, colWorld);
}